

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderCheckMark(ImDrawList *draw_list,ImVec2 pos,ImU32 col,float sz)

{
  ImVec2 *pIVar1;
  ImVec2 *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float thickness;
  float fVar6;
  float fVar7;
  float fVar8;
  
  thickness = sz / 5.0;
  if (thickness <= 1.0) {
    thickness = 1.0;
  }
  fVar6 = sz - thickness * 0.5;
  fVar7 = fVar6 / 3.0;
  fVar8 = pos.x + thickness * 0.25 + fVar7;
  fVar6 = (pos.y + thickness * 0.25 + fVar6) - fVar7 * 0.5;
  iVar4 = (draw_list->_Path).Size;
  iVar5 = (draw_list->_Path).Capacity;
  if (iVar4 == iVar5) {
    iVar4 = iVar4 + 1;
    if (iVar5 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar5 / 2 + iVar5;
    }
    if (iVar4 < iVar3) {
      iVar4 = iVar3;
    }
    if (iVar5 < iVar4) {
      pIVar2 = (ImVec2 *)MemAlloc((long)iVar4 << 3);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar2;
      (draw_list->_Path).Capacity = iVar4;
    }
  }
  pIVar1 = (draw_list->_Path).Data;
  iVar4 = (draw_list->_Path).Size;
  pIVar1[iVar4].x = fVar8 - fVar7;
  pIVar1[iVar4].y = fVar6 - fVar7;
  iVar5 = (draw_list->_Path).Size;
  iVar3 = (draw_list->_Path).Capacity;
  iVar4 = iVar5 + 1;
  (draw_list->_Path).Size = iVar4;
  if (iVar4 == iVar3) {
    iVar5 = iVar5 + 2;
    if (iVar3 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar3 / 2 + iVar3;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar3 < iVar5) {
      pIVar2 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar2;
      (draw_list->_Path).Capacity = iVar5;
    }
  }
  pIVar1 = (draw_list->_Path).Data;
  iVar4 = (draw_list->_Path).Size;
  pIVar1[iVar4].x = fVar8;
  pIVar1[iVar4].y = fVar6;
  iVar5 = (draw_list->_Path).Size;
  iVar3 = (draw_list->_Path).Capacity;
  iVar4 = iVar5 + 1;
  (draw_list->_Path).Size = iVar4;
  if (iVar4 == iVar3) {
    iVar5 = iVar5 + 2;
    if (iVar3 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar3 / 2 + iVar3;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar3 < iVar5) {
      pIVar2 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar2;
      (draw_list->_Path).Capacity = iVar5;
    }
  }
  pIVar1 = (draw_list->_Path).Data;
  iVar4 = (draw_list->_Path).Size;
  pIVar1[iVar4].x = fVar7 + fVar7 + fVar8;
  pIVar1[iVar4].y = -fVar7 + -fVar7 + fVar6;
  iVar4 = (draw_list->_Path).Size + 1;
  (draw_list->_Path).Size = iVar4;
  ImDrawList::AddPolyline(draw_list,(draw_list->_Path).Data,iVar4,col,0,thickness);
  (draw_list->_Path).Size = 0;
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImDrawList* draw_list, ImVec2 pos, ImU32 col, float sz)
{
    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness * 0.5f;
    pos += ImVec2(thickness * 0.25f, thickness * 0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third * 0.5f;
    draw_list->PathLineTo(ImVec2(bx - third, by - third));
    draw_list->PathLineTo(ImVec2(bx, by));
    draw_list->PathLineTo(ImVec2(bx + third * 2.0f, by - third * 2.0f));
    draw_list->PathStroke(col, 0, thickness);
}